

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.cpp
# Opt level: O2

void (anonymous_namespace)::
     accept_test_case<std::map<std::__cxx11::string,std::vector<ut::test_case*,std::allocator<ut::test_case*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<ut::test_case*,std::allocator<ut::test_case*>>>>>>
               (void *map,test_case *i_test)

{
  mapped_type *this;
  allocator local_49;
  test_case *local_48;
  char *local_40 [2];
  key_type local_30;
  
  local_48 = i_test;
  (**(code **)(*(long *)i_test + 0x10))(local_40);
  std::__cxx11::string::string((string *)&local_30,local_40[0],&local_49);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ut::test_case_*,_std::allocator<ut::test_case_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ut::test_case_*,_std::allocator<ut::test_case_*>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ut::test_case_*,_std::allocator<ut::test_case_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ut::test_case_*,_std::allocator<ut::test_case_*>_>_>_>_>
                       *)map,&local_30);
  std::vector<ut::test_case_*,_std::allocator<ut::test_case_*>_>::push_back(this,&local_48);
  std::__cxx11::string::~string((string *)&local_30);
  ut::exportable::immutable_basic_string<char>::~immutable_basic_string
            ((immutable_basic_string<char> *)local_40);
  return;
}

Assistant:

void accept_test_case(void *map, ut::test_case *i_test)
	{
		(*static_cast<MapT*>(map))[i_test->fixture_name().c_str()].push_back(i_test);
	}